

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O0

void gimage::getPrefixAlternatives
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *list,string *depthname,char *spath)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  size_type sVar4;
  char *pcVar5;
  reference pvVar6;
  reference pvVar7;
  char *in_RDX;
  char *in_RSI;
  value_type *in_RDI;
  bool in_stack_00000026;
  char in_stack_00000027;
  string *in_stack_00000028;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000030;
  int k;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dir;
  int n;
  size_t pos;
  size_t spos;
  value_type *in_stack_fffffffffffffe58;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  reference in_stack_fffffffffffffe70;
  string local_130 [32];
  string local_110 [36];
  int local_ec;
  ulong local_e8;
  allocator local_d9;
  string local_d8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  int local_9c;
  string local_98 [32];
  string local_78 [48];
  string local_48 [32];
  ulong local_28;
  ulong local_20;
  char *local_18;
  char *local_10;
  value_type *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  lVar3 = std::__cxx11::string::find_last_of(in_RSI,0x1dbfac);
  if (lVar3 == -1) {
    local_20 = 0;
  }
  else {
    local_20 = lVar3 + 1;
  }
  local_28 = std::__cxx11::string::rfind((char)local_10,0x3a);
  if ((local_28 != 0xffffffffffffffff) &&
     (iVar2 = std::__cxx11::string::compare((ulong)local_10,local_28,(char *)0x2), iVar2 != 0)) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)local_10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(local_48);
  }
  local_28 = std::__cxx11::string::rfind((char)local_10,0x2e);
  if ((local_28 != 0xffffffffffffffff) && (local_20 < local_28)) {
    std::__cxx11::string::substr((ulong)local_78,(ulong)local_10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(local_78);
  }
  local_28 = std::__cxx11::string::rfind((char)local_10,0x5f);
  while (local_28 != 0xffffffffffffffff && local_20 < local_28) {
    std::__cxx11::string::substr((ulong)local_98,(ulong)local_10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(local_98);
    local_28 = std::__cxx11::string::rfind((char)local_10,0x5f);
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_8);
  local_9c = (int)sVar4;
  if ((local_18 != (char *)0x0) && (*local_18 != '\0')) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x193bca);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,local_18,&local_d9);
    gutil::split(in_stack_00000030,in_stack_00000028,in_stack_00000027,in_stack_00000026);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    for (local_e8 = 0; uVar1 = local_e8,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_b8), uVar1 < sVar4; local_e8 = local_e8 + 1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8;
      in_stack_fffffffffffffe70 =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)__lhs,local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)__lhs,local_e8);
      std::__cxx11::string::size();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)in_stack_fffffffffffffe70);
      if (*pcVar5 != '/') {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_b8,local_e8);
        std::__cxx11::string::push_back((char)pvVar6);
      }
      for (local_ec = 0; local_ec < local_9c; local_ec = local_ec + 1) {
        __x = local_8;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_b8,local_e8);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_8,(long)local_ec);
        std::__cxx11::string::substr((ulong)local_130,(ulong)pvVar7);
        std::operator+(__lhs,pvVar6);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)pvVar6,__x);
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string(local_130);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe70);
  }
  return;
}

Assistant:

void getPrefixAlternatives(std::vector<std::string> &list, const std::string &depthname,
                           const char *spath)
{
  // determine possible prefixes

  size_t spos, pos;

  spos=depthname.find_last_of("/\\");

  if (spos == depthname.npos)
  {
    spos=0;
  }
  else
  {
    spos++;
  }

  pos=depthname.rfind(':');

  if (pos != depthname.npos && depthname.compare(pos, 2, ":\\") != 0)
  {
    list.push_back(depthname.substr(0, pos));
  }

  pos=depthname.rfind('.');

  if (pos != depthname.npos && pos > spos)
  {
    list.push_back(depthname.substr(0, pos));
  }

  pos=depthname.rfind('_', pos-1);

  while (pos != depthname.npos && pos > spos)
  {
    list.push_back(depthname.substr(0, pos));
    pos=depthname.rfind('_', pos-1);
  }

  int n=static_cast<int>(list.size());

  // combine possible prefixes with all directories of the optional search
  // path

  if (spath != 0 && spath[0] != '\0')
  {
    std::vector<std::string> dir;

#ifdef WIN32
    gutil::split(dir, spath, ';');
#else
    gutil::split(dir, spath, ':');
#endif

    for (size_t i=0; i<dir.size(); i++)
    {
#ifdef WIN32

      if (dir[i][dir[i].size()-1] != '\\')
      {
        dir[i].push_back('\\');
      }

#else

      if (dir[i][dir[i].size()-1] != '/')
      {
        dir[i].push_back('/');
      }

#endif

      for (int k=0; k<n; k++)
      {
        list.push_back(dir[i]+list[k].substr(spos));
      }
    }
  }
}